

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O3

optional<wasm::HeapType> wasm::HeapType::getLeastUpperBound(HeapType a,HeapType b)

{
  _Storage<wasm::HeapType,_true> _Var1;
  BasicHeapType BVar2;
  BasicHeapType BVar3;
  uint uVar4;
  BasicHeapType b_00;
  BasicHeapType b_01;
  _Storage<wasm::HeapType,_true> _Var5;
  undefined8 unaff_R14;
  ulong uVar6;
  undefined7 uVar7;
  _Storage<wasm::HeapType,_true> _Var8;
  bool bVar9;
  pair<std::__detail::_Node_iterator<wasm::(anonymous_namespace)::HeapTypeInfo_*,_true,_false>,_bool>
  pVar10;
  optional<wasm::HeapType> oVar11;
  undefined1 local_98 [8];
  unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
  seen;
  HeapTypeInfo *infoA;
  HeapTypeInfo *infoB;
  _Storage<wasm::HeapType,_true> local_48;
  _Storage<wasm::HeapType,_true> local_40;
  HeapType a_local;
  HeapType b_local;
  
  uVar6 = CONCAT71((int7)((ulong)unaff_R14 >> 8),1);
  if (a.id == b.id) goto LAB_00cad135;
  local_40 = (_Storage<wasm::HeapType,_true>)a.id;
  a_local = b;
  BVar2 = getBottom(&local_40._M_value);
  a.id._4_4_ = 0;
  a.id._0_4_ = BVar2;
  BVar3 = getBottom(&a_local);
  _Var8 = (_Storage<wasm::HeapType,_true>)a_local;
  _Var5 = local_40;
  if (BVar2 != BVar3) {
    uVar6 = 0;
    goto LAB_00cad135;
  }
  if ((ulong)local_40 < 0x7d) {
    uVar4 = local_40._0_4_ & 0x7b;
    a = a_local;
    if ((uVar4 << 0x1d | uVar4 - 8 >> 3) - 10 < 5) goto LAB_00cad135;
    if (a_local.id < 0x7d) {
      uVar4 = (uint)a_local.id & 0x7b;
      uVar4 = uVar4 << 0x1d | uVar4 - 8 >> 3;
      goto joined_r0x00cacffc;
    }
  }
  else if (a_local.id < 0x7d) {
    uVar4 = (uint)a_local.id & 0x7b;
    uVar4 = uVar4 << 0x1d | uVar4 - 8 >> 3;
joined_r0x00cacffc:
    a.id = (uintptr_t)local_40;
    if (uVar4 - 10 < 5) goto LAB_00cad135;
  }
  else {
    seen._M_h._M_single_bucket = (__node_base_ptr)local_40;
    infoA = (HeapTypeInfo *)a_local.id;
    if (*(int *)((long)local_40 + 0x30) == *(int *)(a_local.id + 0x30)) {
      local_98 = (undefined1  [8])&seen._M_h._M_rehash_policy._M_next_resize;
      seen._M_h._M_buckets = (__buckets_ptr)0x1;
      seen._M_h._M_bucket_count = 0;
      seen._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      seen._M_h._M_element_count._0_4_ = 0x3f800000;
      seen._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      seen._M_h._M_rehash_policy._4_4_ = 0;
      seen._M_h._M_rehash_policy._M_next_resize = 0;
      std::
      unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
      ::insert((unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
                *)local_98,(value_type *)&seen._M_h._M_single_bucket);
      std::
      unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
      ::insert((unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
                *)local_98,&infoA);
      do {
        a.id = *(uintptr_t *)((long)_Var5 + 8);
        _Var1 = *(_Storage<wasm::HeapType,_true> *)((long)_Var8 + 8);
        bVar9 = _Var1 == (_Storage<wasm::HeapType,_true>)0x0;
        uVar7 = (undefined7)(uVar6 >> 8);
        uVar6 = CONCAT71(uVar7,bVar9);
        infoB = (HeapTypeInfo *)a.id;
        local_48 = _Var1;
        if ((_Storage<wasm::HeapType,_true>)a.id == (_Storage<wasm::HeapType,_true>)0x0 && bVar9) {
          BVar2 = anon_unknown_0::getBasicHeapSupertype(local_40._M_value.id);
          BVar3 = anon_unknown_0::getBasicHeapSupertype(a_local);
          oVar11 = anon_unknown_0::getBasicHeapTypeLUB((anon_unknown_0 *)(ulong)BVar2,BVar3,b_01);
          a.id = oVar11.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::HeapType>._M_payload;
          uVar6 = (ulong)oVar11.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::HeapType>._8_4_;
          goto LAB_00cad129;
        }
        if (((_Storage<wasm::HeapType,_true>)a.id != (_Storage<wasm::HeapType,_true>)0x0) &&
           (pVar10 = std::
                     unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
                     ::insert((unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
                               *)local_98,&infoB), _Var5 = (_Storage<wasm::HeapType,_true>)a.id,
           ((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0)) {
          uVar6 = CONCAT71(uVar7,1);
          goto LAB_00cad129;
        }
      } while ((bVar9) ||
              (pVar10 = std::
                        unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
                        ::insert((unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
                                  *)local_98,(value_type *)&local_48), _Var8 = _Var1,
              ((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0));
      uVar6 = CONCAT71(uVar7,1);
      a.id = (uintptr_t)_Var1;
LAB_00cad129:
      std::
      unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
      ::~unordered_set((unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
                        *)local_98);
      goto LAB_00cad135;
    }
  }
  BVar2 = anon_unknown_0::getBasicHeapSupertype(local_40._M_value.id);
  BVar3 = anon_unknown_0::getBasicHeapSupertype(a_local);
  oVar11 = anon_unknown_0::getBasicHeapTypeLUB((anon_unknown_0 *)(ulong)BVar2,BVar3,b_00);
  uVar6 = (ulong)oVar11.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::HeapType>._8_4_;
  a.id = (uintptr_t)
         oVar11.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::HeapType>._M_payload;
LAB_00cad135:
  oVar11.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = uVar6 & 0xffffffff;
  oVar11.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)a.id;
  return (optional<wasm::HeapType>)
         oVar11.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::HeapType>;
}

Assistant:

std::optional<HeapType> HeapType::getLeastUpperBound(HeapType a, HeapType b) {
  if (a == b) {
    return a;
  }
  if (a.getBottom() != b.getBottom()) {
    return {};
  }
  if (a.isBottom()) {
    return b;
  }
  if (b.isBottom()) {
    return a;
  }
  if (a.isBasic() || b.isBasic()) {
    return getBasicHeapTypeLUB(getBasicHeapSupertype(a),
                               getBasicHeapSupertype(b));
  }

  auto* infoA = getHeapTypeInfo(a);
  auto* infoB = getHeapTypeInfo(b);

  if (infoA->kind != infoB->kind) {
    return getBasicHeapTypeLUB(getBasicHeapSupertype(a),
                               getBasicHeapSupertype(b));
  }

  // Walk up the subtype tree to find the LUB. Ascend the tree from both `a`
  // and `b` in lockstep. The first type we see for a second time must be the
  // LUB because there are no cycles and the only way to encounter a type
  // twice is for it to be on the path above both `a` and `b`.
  std::unordered_set<HeapTypeInfo*> seen;
  seen.insert(infoA);
  seen.insert(infoB);
  while (true) {
    auto* nextA = infoA->supertype;
    auto* nextB = infoB->supertype;
    if (nextA == nullptr && nextB == nullptr) {
      // Did not find a LUB in the subtype tree.
      return getBasicHeapTypeLUB(getBasicHeapSupertype(a),
                                 getBasicHeapSupertype(b));
    }
    if (nextA) {
      if (!seen.insert(nextA).second) {
        return HeapType(uintptr_t(nextA));
      }
      infoA = nextA;
    }
    if (nextB) {
      if (!seen.insert(nextB).second) {
        return HeapType(uintptr_t(nextB));
      }
      infoB = nextB;
    }
  }
}